

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_server.c
# Opt level: O0

void mk_server_loop(mk_server *server)

{
  uint64_t val;
  mk_server *server_local;
  
  mk_utils_worker_rename("monkey: server");
  if (server->lib_mode == 0) {
    mk_print(0x1000,"HTTP Server started");
  }
  mk_sched_broadcast_signal(server,0xeeeeeeee);
  mk_server_lib_notify_started(server);
  if (server->scheduler_mode != '\x01') {
    mk_server_loop_balancer(server);
  }
  return;
}

Assistant:

void mk_server_loop(struct mk_server *server)
{
    uint64_t val;

    /* Rename worker */
    mk_utils_worker_rename("monkey: server");

    if (server->lib_mode == MK_FALSE) {
        mk_info("HTTP Server started");
    }

    /* Wake up workers */
    val = MK_SERVER_SIGNAL_START;
    mk_sched_broadcast_signal(server, val);

    /* Signal lib caller (if any) */
    mk_server_lib_notify_started(server);

    /*
     * When using REUSEPORT mode on the Scheduler, we need to signal
     * them so they can start processing connections.
     */
    if (server->scheduler_mode == MK_SCHEDULER_REUSEPORT) {
        /* do thing :) */
    }
    else {
        /* FIXME!: this old mode needs some checks on library mode */
        mk_server_loop_balancer(server);
    }
}